

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O1

void __thiscall wasm::SafeHeap::addStoreFunc(SafeHeap *this,Store style,Module *module)

{
  Type addressType;
  char *pcVar1;
  Name name;
  Type TVar2;
  Function *pFVar3;
  Block *this_00;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this_01;
  LocalSet *item;
  undefined1 *puVar6;
  ExpressionList *this_02;
  BinaryOp BVar7;
  Name name_00;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name name_01;
  Type local_98;
  Type local_90;
  HeapType local_88;
  MixedArena *local_80;
  SafeHeap *local_78;
  Memory *local_70;
  Module *local_68;
  Type local_60;
  Builder builder;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  
  name_00 = getStoreName(&style);
  pFVar3 = Module::getFunctionOrNull(module,name_00);
  if (pFVar3 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_78 = this;
    local_70 = Module::getMemory(module,name);
    TVar2 = style.valueType;
    addressType.id = (local_70->addressType).id;
    types._M_len = 3;
    types._M_array = &stack0xffffffffffffffa0;
    local_60.id = addressType.id;
    builder.wasm = (Module *)addressType.id;
    wasm::Type::Type(&local_98,types);
    sig.results.id = 0;
    sig.params.id = local_98.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = &local_90;
    local_90.id = addressType.id;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa0,__l,
               (allocator_type *)
               ((long)&func._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7));
    name_01.super_IString.str._M_str = name_00.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeFunction
              (name_01,(HeapType)name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,
               (Expression *)&stack0xffffffffffffffa0);
    if ((void *)local_60.id != (void *)0x0) {
      operator_delete((void *)local_60.id,TVar2.id - local_60.id);
    }
    local_80 = &module->allocator;
    local_68 = module;
    local_60.id = (uintptr_t)module;
    this_00 = (Block *)MixedArena::allocSpace(local_80,0x40,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_00->name).super_IString.str._M_len = 0;
    (this_00->name).super_IString.str._M_str = (char *)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    BVar7 = AddInt64;
    if (addressType.id != 3) {
      BVar7 = AddInt32;
    }
    (this_00->list).allocator = local_80;
    pEVar4 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = 0;
    (pEVar4->type).id = addressType.id;
    pEVar5 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    pEVar5->_id = LocalGetId;
    *(undefined4 *)(pEVar5 + 1) = 1;
    (pEVar5->type).id = addressType.id;
    this_01 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar7;
    this_01->left = pEVar4;
    this_01->right = pEVar5;
    Binary::finalize(this_01);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffa0,3,(Expression *)this_01);
    this_02 = &this_00->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar4 = makeBoundsCheck(local_78,style.valueType,(Builder *)&stack0xffffffffffffffa0,0,3,
                             (uint)style.bytes,local_68,addressType,addressType.id == 3,
                             (Name)(local_70->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    if (1 < style.align.addr) {
      pEVar4 = makeAlignCheck(local_78,style.align,(Builder *)&stack0xffffffffffffffa0,3,local_68,
                              (Name)(local_70->super_Importable).super_Named.name.super_IString.str)
      ;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_02->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4)
      ;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(local_80,0x58,8);
    *(undefined8 *)pEVar4 = 0;
    (pEVar4->type).id = 0;
    *(undefined8 *)(pEVar4 + 2) = 0;
    pEVar4[2].type.id = 0;
    *(undefined8 *)(pEVar4 + 1) = 0;
    pEVar4[1].type.id = 0;
    *(undefined8 *)(pEVar4 + 4) = 0;
    pEVar4[4].type.id = 0;
    *(undefined8 *)(pEVar4 + 3) = 0;
    pEVar4[3].type.id = 0;
    *(undefined8 *)(pEVar4 + 5) = 0;
    pEVar4->_id = StoreId;
    (pEVar4->type).id = 0;
    pEVar4[1].type.id = 0;
    *(undefined8 *)(pEVar4 + 2) = 0;
    pEVar4->_id = style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._id;
    *(undefined7 *)&pEVar4->field_0x1 =
         style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._1_7_;
    (pEVar4->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.type.id;
    pEVar4[1]._id = style.bytes;
    pEVar4[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar4 + 2) = style.align.addr;
    pEVar4[2].type.id = style._40_8_;
    *(Expression **)(pEVar4 + 3) = style.ptr;
    pEVar4[3].type.id = (uintptr_t)style.value;
    *(uintptr_t *)(pEVar4 + 4) = style.valueType.id;
    pEVar4[4].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar4 + 5) = style.memory.super_IString.str._M_str;
    pcVar1 = (local_70->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar4[4].type.id = (local_70->super_Importable).super_Named.name.super_IString.str._M_len;
    *(char **)(pEVar4 + 5) = pcVar1;
    puVar6 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    TVar2 = style.valueType;
    *puVar6 = 8;
    *(undefined4 *)(puVar6 + 0x10) = 3;
    *(uintptr_t *)(puVar6 + 8) = addressType.id;
    *(undefined1 **)(pEVar4 + 3) = puVar6;
    puVar6 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_60.id + 0x200),0x18,8);
    *puVar6 = 8;
    *(undefined4 *)(puVar6 + 0x10) = 2;
    *(uintptr_t *)(puVar6 + 8) = TVar2.id;
    pEVar4[3].type.id = (uintptr_t)puVar6;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    Block::finalize(this_00,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
    (local_40._M_head_impl)->body = (Expression *)this_00;
    Module::addFunction(local_68,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )&local_40);
    if (local_40._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_40,local_40._M_head_impl);
    }
  }
  return;
}

Assistant:

void addStoreFunc(Store style, Module* module) {
    auto name = getStoreName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    bool is64 = memory->is64();
    // pointer, offset, value
    auto funcSig =
      Signature({addressType, addressType, style.valueType}, Type::none);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      3,
      builder.makeBinary(is64 ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.valueType,
                                          builder,
                                          0,
                                          3,
                                          style.bytes,
                                          module,
                                          addressType,
                                          is64,
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 3, module, memory->name));
    }
    // do the store
    auto* store = module->allocator.alloc<Store>();
    *store = style; // basically the same as the template we are given!
    store->memory = memory->name;
    store->ptr = builder.makeLocalGet(3, addressType);
    store->value = builder.makeLocalGet(2, style.valueType);
    block->list.push_back(store);
    block->finalize(Type::none);
    func->body = block;
    module->addFunction(std::move(func));
  }